

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Buf_ManStop(Buf_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Buf_Man_t *p_local;
  
  printf("Sep = %d. Dup = %d. Br0 = %d. Br1 = %d. BrC = %d.  ",(ulong)(uint)p->nSeparate,
         (ulong)(uint)p->nDuplicate,(ulong)(uint)p->nBranch0,(ulong)(uint)p->nBranch1,
         (ulong)(uint)p->nBranchCrit);
  uVar1 = p->nObjStart;
  iVar4 = Abc_NtkObjNumMax(p->pNtk);
  iVar2 = p->nObjStart;
  iVar3 = p->nObjAlloc;
  iVar5 = Abc_NtkObjNumMax(p->pNtk);
  printf("Orig = %d. Add = %d. Rem = %d.\n",(ulong)uVar1,(ulong)(uint)(iVar4 - iVar2),
         (ulong)(uint)(iVar3 - iVar5));
  Vec_PtrFree(p->vFanouts);
  Vec_IntFree(p->vTfCone);
  Vec_IntFree(p->vNonCrit);
  Vec_IntFree(p->vDelays);
  Vec_IntFree(p->vOrder);
  Vec_IntFree(p->vOffsets);
  Vec_IntFree(p->vEdges);
  Vec_IntFree(p->vArr);
  Vec_IntFree(p->vDep);
  Vec_QueFree(p->vQue);
  Vec_FltFree(p->vCounts);
  if (p != (Buf_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Buf_ManStop( Buf_Man_t * p )
{
    printf( "Sep = %d. Dup = %d. Br0 = %d. Br1 = %d. BrC = %d.  ", 
        p->nSeparate, p->nDuplicate, p->nBranch0, p->nBranch1, p->nBranchCrit );
    printf( "Orig = %d. Add = %d. Rem = %d.\n", 
        p->nObjStart, Abc_NtkObjNumMax(p->pNtk) - p->nObjStart, 
        p->nObjAlloc - Abc_NtkObjNumMax(p->pNtk) );
    Vec_PtrFree( p->vFanouts );
    Vec_IntFree( p->vTfCone );
    Vec_IntFree( p->vNonCrit );
    Vec_IntFree( p->vDelays );
    Vec_IntFree( p->vOrder );
    Vec_IntFree( p->vOffsets );
    Vec_IntFree( p->vEdges );
    Vec_IntFree( p->vArr );
    Vec_IntFree( p->vDep );
//    Vec_QueCheck( p->vQue );
    Vec_QueFree( p->vQue );
    Vec_FltFree( p->vCounts );
    ABC_FREE( p );
}